

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O1

void deqp::gles3::Functional::eval_refract_vec3(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  float fVar2;
  float res;
  Vector<float,_3> res_3;
  Vector<float,_3> res_1;
  Vector<float,_3> res_2;
  float afStack_60 [6];
  float local_48;
  float local_44 [3];
  Vec4 *local_38;
  ulong local_30;
  undefined4 local_28;
  float local_20 [3];
  undefined8 local_14;
  float local_c;
  
  local_44[0] = c->in[0].m_data[2];
  local_44[1] = c->in[0].m_data[0];
  local_44[2] = c->in[0].m_data[1];
  local_14 = *(undefined8 *)(c->in[1].m_data + 1);
  local_c = c->in[1].m_data[0];
  local_48 = c->in[2].m_data[1];
  afStack_60[5] = 0.0;
  lVar1 = 0;
  do {
    afStack_60[5] = afStack_60[5] + *(float *)((long)&local_14 + lVar1 * 4) * local_44[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar2 = 1.0 - local_48 * local_48 * (1.0 - afStack_60[5] * afStack_60[5]);
  if (0.0 <= fVar2) {
    local_30 = local_30 & 0xffffffff00000000;
    local_38 = (Vec4 *)0x0;
    lVar1 = 0;
    do {
      *(float *)((long)&local_38 + lVar1 * 4) = local_44[lVar1] * local_48;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    if (fVar2 < 0.0) {
      afStack_60[0] = 6.969401e-39;
      afStack_60[1] = 0.0;
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
    local_20[2] = 0.0;
    local_20[0] = 0.0;
    local_20[1] = 0.0;
    lVar1 = 0;
    do {
      local_20[lVar1] = *(float *)((long)&local_14 + lVar1 * 4) * (local_48 * afStack_60[5] + fVar2)
      ;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    afStack_60[4] = 0.0;
    afStack_60[2] = 0.0;
    afStack_60[3] = 0.0;
    lVar1 = 0;
    do {
      afStack_60[lVar1 + 2] = *(float *)((long)&local_38 + lVar1 * 4) - local_20[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
  }
  else {
    afStack_60[4] = 0.0;
    afStack_60[2] = 0.0;
    afStack_60[3] = 0.0;
  }
  local_38 = &c->color;
  local_30 = 0x100000000;
  local_28 = 2;
  lVar1 = 2;
  do {
    (c->color).m_data[*(int *)((long)&local_38 + lVar1 * 4)] = afStack_60[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

void eval_refract_vec3	(ShaderEvalContext& c) { c.color.xyz()	= refract(c.in[0].swizzle(2, 0, 1),    c.in[1].swizzle(1, 2, 0),    c.in[2].y()); }